

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O1

void m68k_op_rtr_32(void)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = m68ki_cpu.dar[0xf];
  m68ki_cpu.dar[0xf] = m68ki_cpu.dar[0xf] + 2;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(uVar1);
  }
  uVar2 = m68k_read_memory_16(uVar1 & m68ki_cpu.address_mask);
  uVar1 = m68ki_cpu.dar[0xf];
  m68ki_cpu.x_flag = uVar2 << 4 & 0x100;
  m68ki_cpu.n_flag = uVar2 << 4 & 0x80;
  m68ki_cpu.not_z_flag = (uint)((uVar2 & 4) == 0);
  m68ki_cpu.v_flag = (uVar2 & 2) << 6;
  m68ki_cpu.c_flag = (uVar2 & 1) << 8;
  m68ki_cpu.dar[0xf] = m68ki_cpu.dar[0xf] + 4;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar1 = pmmu_translate_addr(uVar1);
  }
  m68ki_cpu.pc = m68k_read_memory_32(uVar1 & m68ki_cpu.address_mask);
  return;
}

Assistant:

static void m68k_op_rtr_32(void)
{
	m68ki_trace_t0();				   /* auto-disable (see m68kcpu.h) */
	m68ki_set_ccr(m68ki_pull_16());
	m68ki_jump(m68ki_pull_32());
}